

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::rescalePartials
          (BeagleCPUImpl<float,_1,_0> *this,float *destP,float *scaleFactors,
          float *cumulativeScaleFactors,int fillWithOnes)

{
  float *pfVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined8 uVar16;
  bool bVar17;
  byte bVar18;
  byte bVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  ushort uVar27;
  float fVar28;
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  
  if (0 < this->kPatternCount) {
    lVar26 = 0;
    auVar29 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar30 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      iVar2 = this->kPartialsPaddedStateCount;
      iVar3 = this->kCategoryCount;
      auVar35 = ZEXT816(0) << 0x40;
      auVar36 = ZEXT1664(auVar35);
      if (0 < iVar3) {
        iVar20 = iVar2 * (int)lVar26;
        iVar22 = 0;
        do {
          if (0 < this->kStateCount) {
            lVar24 = 0;
            do {
              auVar35 = vmaxss_avx(ZEXT416((uint)destP[iVar20 + lVar24]),auVar36._0_16_);
              auVar36 = ZEXT1664(auVar35);
              lVar24 = lVar24 + 1;
            } while (this->kStateCount != (int)lVar24);
          }
          auVar35 = auVar36._0_16_;
          iVar22 = iVar22 + 1;
          iVar20 = iVar20 + this->kPaddedPatternCount * iVar2;
        } while (iVar22 != iVar3);
      }
      uVar16 = vcmpss_avx512f(auVar35,ZEXT416(0),0);
      bVar17 = (bool)((byte)uVar16 & 1);
      fVar28 = (float)((uint)bVar17 * 0x3f800000 + (uint)!bVar17 * auVar35._0_4_);
      if (0 < iVar3) {
        iVar20 = this->kStateCount;
        iVar21 = iVar2 * (int)lVar26;
        iVar22 = this->kPaddedPatternCount;
        auVar36 = vpbroadcastq_avx512f();
        auVar31 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar28)));
        iVar23 = 0;
        do {
          if (0 < iVar20) {
            uVar25 = 0;
            do {
              auVar32 = vpbroadcastq_avx512f();
              auVar33 = vporq_avx512f(auVar32,auVar29);
              auVar32 = vporq_avx512f(auVar32,auVar30);
              uVar16 = vpcmpuq_avx512f(auVar32,auVar36,2);
              bVar18 = (byte)uVar16;
              uVar16 = vpcmpuq_avx512f(auVar33,auVar36,2);
              bVar19 = (byte)uVar16;
              uVar27 = CONCAT11(bVar19,bVar18);
              pfVar1 = destP + (long)iVar21 + uVar25;
              auVar32._4_4_ = (uint)((byte)(uVar27 >> 1) & 1) * (int)pfVar1[1];
              auVar32._0_4_ = (uint)(bVar18 & 1) * (int)*pfVar1;
              auVar32._8_4_ = (uint)((byte)(uVar27 >> 2) & 1) * (int)pfVar1[2];
              auVar32._12_4_ = (uint)((byte)(uVar27 >> 3) & 1) * (int)pfVar1[3];
              auVar32._16_4_ = (uint)((byte)(uVar27 >> 4) & 1) * (int)pfVar1[4];
              auVar32._20_4_ = (uint)((byte)(uVar27 >> 5) & 1) * (int)pfVar1[5];
              auVar32._24_4_ = (uint)((byte)(uVar27 >> 6) & 1) * (int)pfVar1[6];
              auVar32._28_4_ = (uint)((byte)(uVar27 >> 7) & 1) * (int)pfVar1[7];
              auVar32._32_4_ = (uint)(bVar19 & 1) * (int)pfVar1[8];
              auVar32._36_4_ = (uint)(bVar19 >> 1 & 1) * (int)pfVar1[9];
              auVar32._40_4_ = (uint)(bVar19 >> 2 & 1) * (int)pfVar1[10];
              auVar32._44_4_ = (uint)(bVar19 >> 3 & 1) * (int)pfVar1[0xb];
              auVar32._48_4_ = (uint)(bVar19 >> 4 & 1) * (int)pfVar1[0xc];
              auVar32._52_4_ = (uint)(bVar19 >> 5 & 1) * (int)pfVar1[0xd];
              auVar32._56_4_ = (uint)(bVar19 >> 6 & 1) * (int)pfVar1[0xe];
              auVar32._60_4_ = (uint)(bVar19 >> 7) * (int)pfVar1[0xf];
              auVar32 = vmulps_avx512f(auVar31,auVar32);
              pfVar1 = destP + (long)iVar21 + uVar25;
              bVar17 = (bool)((byte)(uVar27 >> 1) & 1);
              bVar4 = (bool)((byte)(uVar27 >> 2) & 1);
              bVar5 = (bool)((byte)(uVar27 >> 3) & 1);
              bVar6 = (bool)((byte)(uVar27 >> 4) & 1);
              bVar7 = (bool)((byte)(uVar27 >> 5) & 1);
              bVar8 = (bool)((byte)(uVar27 >> 6) & 1);
              bVar9 = (bool)((byte)(uVar27 >> 7) & 1);
              bVar10 = (bool)(bVar19 >> 1 & 1);
              bVar11 = (bool)(bVar19 >> 2 & 1);
              bVar12 = (bool)(bVar19 >> 3 & 1);
              bVar13 = (bool)(bVar19 >> 4 & 1);
              bVar14 = (bool)(bVar19 >> 5 & 1);
              bVar15 = (bool)(bVar19 >> 6 & 1);
              *pfVar1 = (float)((uint)(bVar18 & 1) * auVar32._0_4_ |
                               (uint)!(bool)(bVar18 & 1) * (int)*pfVar1);
              pfVar1[1] = (float)((uint)bVar17 * auVar32._4_4_ | (uint)!bVar17 * (int)pfVar1[1]);
              pfVar1[2] = (float)((uint)bVar4 * auVar32._8_4_ | (uint)!bVar4 * (int)pfVar1[2]);
              pfVar1[3] = (float)((uint)bVar5 * auVar32._12_4_ | (uint)!bVar5 * (int)pfVar1[3]);
              pfVar1[4] = (float)((uint)bVar6 * auVar32._16_4_ | (uint)!bVar6 * (int)pfVar1[4]);
              pfVar1[5] = (float)((uint)bVar7 * auVar32._20_4_ | (uint)!bVar7 * (int)pfVar1[5]);
              pfVar1[6] = (float)((uint)bVar8 * auVar32._24_4_ | (uint)!bVar8 * (int)pfVar1[6]);
              pfVar1[7] = (float)((uint)bVar9 * auVar32._28_4_ | (uint)!bVar9 * (int)pfVar1[7]);
              pfVar1[8] = (float)((uint)(bVar19 & 1) * auVar32._32_4_ |
                                 (uint)!(bool)(bVar19 & 1) * (int)pfVar1[8]);
              pfVar1[9] = (float)((uint)bVar10 * auVar32._36_4_ | (uint)!bVar10 * (int)pfVar1[9]);
              pfVar1[10] = (float)((uint)bVar11 * auVar32._40_4_ | (uint)!bVar11 * (int)pfVar1[10]);
              pfVar1[0xb] = (float)((uint)bVar12 * auVar32._44_4_ | (uint)!bVar12 * (int)pfVar1[0xb]
                                   );
              pfVar1[0xc] = (float)((uint)bVar13 * auVar32._48_4_ | (uint)!bVar13 * (int)pfVar1[0xc]
                                   );
              pfVar1[0xd] = (float)((uint)bVar14 * auVar32._52_4_ | (uint)!bVar14 * (int)pfVar1[0xd]
                                   );
              pfVar1[0xe] = (float)((uint)bVar15 * auVar32._56_4_ | (uint)!bVar15 * (int)pfVar1[0xe]
                                   );
              pfVar1[0xf] = (float)((uint)(bVar19 >> 7) * auVar32._60_4_ |
                                   (uint)!(bool)(bVar19 >> 7) * (int)pfVar1[0xf]);
              uVar25 = uVar25 + 0x10;
            } while ((iVar20 + 0xfU & 0xfffffff0) != uVar25);
          }
          iVar23 = iVar23 + 1;
          iVar21 = iVar21 + iVar2 * iVar22;
        } while (iVar23 != iVar3);
      }
      if ((this->kFlags & 0x400) == 0) {
        scaleFactors[lVar26] = fVar28;
        if (cumulativeScaleFactors != (float *)0x0) {
          dVar34 = log((double)fVar28);
          fVar28 = (float)(dVar34 + (double)cumulativeScaleFactors[lVar26]);
LAB_0013d324:
          cumulativeScaleFactors[lVar26] = fVar28;
        }
      }
      else {
        dVar34 = log((double)fVar28);
        scaleFactors[lVar26] = (float)dVar34;
        if (cumulativeScaleFactors != (float *)0x0) {
          fVar28 = (float)dVar34 + cumulativeScaleFactors[lVar26];
          goto LAB_0013d324;
        }
      }
      lVar26 = lVar26 + 1;
      auVar29 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar30 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    } while (lVar26 < this->kPatternCount);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::rescalePartials(REALTYPE* destP,
        REALTYPE* scaleFactors,
        REALTYPE* cumulativeScaleFactors,
        const int  fillWithOnes) {
    if (DEBUGGING_OUTPUT) {
        std::cerr << "destP (before rescale): \n";// << destP << "\n";
        for(int i=0; i<kPartialsSize; i++)
            fprintf(stderr,"destP[%d] = %.5f\n",i,destP[i]);
    }

    // TODO None of the code below has been optimized.
    for (int k = 0; k < kPatternCount; k++) {
        REALTYPE max = 0;
        const int patternOffset = k * kPartialsPaddedStateCount;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
            for (int i = 0; i < kStateCount; i++) {
                if(destP[offset] > max)
                    max = destP[offset];
                offset++;
            }
        }

        if (max == 0)
            max = 1.0;

        REALTYPE oneOverMax = REALTYPE(1.0) / max;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
            for (int i = 0; i < kStateCount; i++)
                destP[offset++] *= oneOverMax;
        }

        if (kFlags & BEAGLE_FLAG_SCALERS_LOG) {
            REALTYPE logMax = log(max);
            scaleFactors[k] = logMax;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += logMax;
        } else {
            scaleFactors[k] = max;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += log(max);
        }
    }
    if (DEBUGGING_OUTPUT) {
        for(int i=0; i<kPatternCount; i++)
            fprintf(stderr,"new scaleFactor[%d] = %.5f\n",i,scaleFactors[i]);
    }
}